

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode
UA_Server_setObjectTypeNode_lifecycleManagement
          (UA_Server *server,UA_NodeId nodeId,UA_ObjectLifecycleManagement olm)

{
  UA_Node *pUVar1;
  UA_StatusCode UVar2;
  
  pUVar1 = UA_NodeStore_get(server->nodestore,&nodeId);
  if (pUVar1 == (UA_Node *)0x0) {
    UVar2 = 0x80340000;
  }
  else {
    UVar2 = 0x805f0000;
    if (pUVar1->nodeClass == UA_NODECLASS_OBJECTTYPE) {
      pUVar1[1].nodeId.identifier.string.length = (size_t)olm.constructor;
      pUVar1[1].nodeId.identifier.string.data = (UA_Byte *)olm.destructor;
      UVar2 = 0;
    }
  }
  return UVar2;
}

Assistant:

UA_StatusCode
UA_Server_setObjectTypeNode_lifecycleManagement(UA_Server *server, UA_NodeId nodeId,
                                                UA_ObjectLifecycleManagement olm) {
    UA_RCU_LOCK();
    UA_StatusCode retval = UA_Server_editNode(server, &adminSession, &nodeId,
                                              (UA_EditNodeCallback)setOLM, &olm);
    UA_RCU_UNLOCK();
    return retval;
}